

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

void losespells(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int local_18;
  uint local_14;
  int i;
  int nzap;
  int n;
  boolean confused;
  
  bVar2 = u.uprops[0x1c].intrinsic != 0;
  book = (obj *)0x0;
  i = 0;
  while( true ) {
    bVar3 = false;
    if (i < 0x2b) {
      bVar3 = spl_book[i].sp_id != 0;
    }
    if (!bVar3) break;
    i = i + 1;
  }
  if (i != 0) {
    iVar1 = rnd(i);
    local_14 = (uint)(iVar1 + bVar2 != 0);
    if (i < (int)local_14) {
      local_14 = i;
    }
    for (local_18 = i - local_14; local_18 < i; local_18 = local_18 + 1) {
      spl_book[local_18].sp_id = 0;
      exercise(2,'\0');
    }
  }
  return;
}

Assistant:

void losespells(void)
{
	boolean confused = (Confusion != 0);
	int  n, nzap, i;

	book = 0;
	for (n = 0; n < MAXSPELL && spellid(n) != NO_SPELL; n++)
		continue;
	if (n) {
		nzap = rnd(n) + confused ? 1 : 0;
		if (nzap > n) nzap = n;
		for (i = n - nzap; i < n; i++) {
		    spellid(i) = NO_SPELL;
		    exercise(A_WIS, FALSE);	/* ouch! */
		}
	}
}